

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-linked_ptr.h
# Opt level: O1

void __thiscall
testing::internal::
linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
::linked_ptr(linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
             *this,linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>_>
                   *ptr)

{
  ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)> *pAVar1;
  linked_ptr_internal *this_00;
  
  if (ptr == this) {
    __assert_fail("&ptr != this",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/urastogi885[P]humanDetectionModule/test/../vendor/googletest/googletest/include/gtest/internal/gtest-linked_ptr.h"
                  ,0x9e,
                  "testing::internal::linked_ptr<testing::ActionInterface<std::vector<cv::Rect_<int>> (cv::Mat)>>::linked_ptr(const linked_ptr<T> &) [T = testing::ActionInterface<std::vector<cv::Rect_<int>> (cv::Mat)>]"
                 );
  }
  pAVar1 = ptr->value_;
  this->value_ = pAVar1;
  this_00 = &this->link_;
  if (pAVar1 != (ActionInterface<std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>_(cv::Mat)>
                 *)0x0) {
    linked_ptr_internal::join(this_00,&ptr->link_);
    return;
  }
  this_00->next_ = this_00;
  return;
}

Assistant:

linked_ptr(linked_ptr const& ptr) {  // NOLINT
    assert(&ptr != this);
    copy(&ptr);
  }